

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumDescriptor.cpp
# Opt level: O1

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString
                (EnumDescriptor *pArray,KUINT32 NumElements,KString *Value,KINT32 *ValueOut)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  KBOOL KVar5;
  
  KVar5 = NumElements != 0;
  if (KVar5) {
    iVar2 = std::__cxx11::string::compare((char *)Value);
    if (iVar2 != 0) {
      uVar3 = (ulong)NumElements;
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar3 == uVar4) {
          return uVar4 < uVar3;
        }
        iVar2 = std::__cxx11::string::compare((char *)Value);
        pArray = pArray + 1;
        uVar1 = uVar4 + 1;
      } while (iVar2 != 0);
      KVar5 = uVar4 < uVar3;
    }
    *ValueOut = pArray->Value;
  }
  return KVar5;
}

Assistant:

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString( const EnumDescriptor * pArray, KUINT32 NumElements, const KString & Value, KINT32 & ValueOut )
{
    for( KINT32 i = 0; i < NumElements; ++i )
    {
        if( Value == pArray[i].Name )
        {
            ValueOut = pArray[i].Value;
            return true;
        }
    }

    // No match found
    return false;
}